

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d.cpp
# Opt level: O3

int __thiscall
ncnn::DeformableConv2D::forward
          (DeformableConv2D *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  pointer pMVar14;
  pointer pMVar15;
  Mat *this_00;
  void *pvVar16;
  size_t sVar17;
  void *pvVar18;
  float *pfVar19;
  size_t sVar20;
  pointer pMVar21;
  void *pvVar22;
  bool bVar23;
  int iVar24;
  bool bVar25;
  int iVar26;
  long lVar27;
  bool bVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  bool bVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  float *pfVar38;
  long lVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  float *pfVar43;
  uint _w;
  uint _h;
  ulong uVar44;
  float *pfVar45;
  bool bVar46;
  float fVar47;
  float fVar48;
  uint uVar49;
  uint uVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  int h_in;
  ulong local_1e0;
  ulong local_1d8;
  void *local_188;
  
  pMVar14 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pMVar15 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  iVar1 = pMVar14->w;
  iVar2 = pMVar14->h;
  uVar3 = pMVar14->c;
  iVar26 = (~((this->kernel_w + -1) * this->dilation_w) + iVar1 + this->pad_left + this->pad_right)
           / this->stride_w;
  _w = iVar26 + 1;
  iVar24 = (~((this->kernel_h + -1) * this->dilation_h) + iVar2 + this->pad_top + this->pad_bottom)
           / this->stride_h;
  _h = iVar24 + 1;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,_w,_h,this->num_output,pMVar14->elemsize,opt->blob_allocator);
  pvVar16 = this_00->data;
  iVar29 = -100;
  if ((pvVar16 != (void *)0x0) && (sVar17 = this_00->cstep, (long)this_00->c * sVar17 != 0)) {
    pvVar18 = (this->weight_data).data;
    local_188 = pvVar18;
    if (this->bias_term != 0) {
      local_188 = (this->bias_data).data;
    }
    if (-1 < iVar24) {
      iVar24 = this->stride_h;
      iVar29 = this->pad_top;
      uVar4 = this->num_output;
      iVar5 = this->stride_w;
      iVar6 = this->pad_left;
      local_1e0 = 0;
      do {
        if (-1 < iVar26) {
          uVar7 = this->kernel_h;
          iVar8 = this->bias_term;
          iVar9 = this->activation_type;
          local_1d8 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar10 = this->kernel_w;
              pfVar19 = (float *)(this->activation_params).data;
              iVar11 = this_00->w;
              sVar20 = this_00->elemsize;
              lVar33 = 0;
              uVar37 = 0;
              do {
                if (iVar8 == 0) {
                  fVar56 = 0.0;
                }
                else {
                  fVar56 = *(float *)((long)local_188 + uVar37 * 4);
                }
                if (0 < (int)uVar7) {
                  lVar35 = (long)this->kernel_w;
                  pMVar21 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  iVar12 = this->dilation_w;
                  iVar13 = this->dilation_h;
                  lVar30 = this->kernel_h * lVar35;
                  pfVar38 = (float *)(lVar30 * lVar33 + (long)pvVar18);
                  uVar32 = 0;
                  do {
                    if (0 < (int)uVar10) {
                      pvVar22 = pMVar14[1].data;
                      lVar36 = pMVar14[1].cstep * pMVar14[1].elemsize;
                      lVar27 = local_1d8 * 4 + (long)pMVar14[1].w * local_1e0 * pMVar14[1].elemsize;
                      uVar40 = 0;
                      pfVar45 = pfVar38;
                      do {
                        lVar31 = uVar32 * lVar35 + uVar40;
                        fVar57 = 1.0;
                        if ((long)pMVar15 - (long)pMVar14 == 0xd8) {
                          fVar57 = *(float *)((long)pMVar21[2].data +
                                             local_1d8 * 4 +
                                             (long)pMVar21[2].w * local_1e0 * pMVar21[2].elemsize +
                                             pMVar21[2].cstep * lVar31 * pMVar21[2].elemsize);
                        }
                        fVar51 = (float)(iVar13 * (int)uVar32 + (iVar24 * (int)local_1e0 - iVar29))
                                 + *(float *)((long)pvVar22 +
                                             (uVar32 * uVar10 + uVar40) * lVar36 * 2 + lVar27);
                        fVar53 = (float)(iVar12 * (int)uVar40 + (iVar5 * (int)local_1d8 - iVar6)) +
                                 *(float *)((long)pvVar22 + (lVar31 * 2 + 1) * lVar36 + lVar27);
                        if ((float)iVar1 <= fVar53 ||
                            (((float)iVar2 <= fVar51 || fVar51 <= -1.0) || fVar53 <= -1.0)) {
                          fVar47 = 0.0;
                          fVar48 = 0.0;
                          fVar60 = 0.0;
                          fVar58 = 0.0;
                          lVar31 = 0;
                          lVar39 = 0;
                          lVar42 = 0;
                          lVar41 = 0;
                          bVar46 = false;
                          bVar28 = false;
                          bVar25 = false;
                          bVar34 = false;
                        }
                        else {
                          fVar47 = floorf(fVar51);
                          fVar48 = floorf(fVar53);
                          uVar49 = (uint)fVar47;
                          uVar50 = (uint)fVar48;
                          fVar58 = fVar51 - (float)(int)uVar49;
                          fVar59 = fVar53 - (float)(int)uVar50;
                          bVar46 = -1 < (int)(uVar49 | uVar50);
                          bVar23 = (int)uVar50 < iVar1 + -1;
                          bVar28 = -1 < (int)uVar49 && bVar23;
                          bVar34 = (int)uVar49 < iVar2 + -1;
                          bVar25 = -1 < (int)uVar50 && bVar34;
                          bVar34 = bVar34 && bVar23;
                          fVar47 = (1.0 - fVar59) * fVar58;
                          fVar48 = fVar58 * fVar59;
                          fVar60 = fVar59 * (1.0 - fVar58);
                          fVar58 = (1.0 - fVar58) * (1.0 - fVar59);
                          lVar39 = (long)(int)uVar50;
                          lVar41 = (long)(int)(uVar50 + 1);
                          lVar31 = (long)(int)uVar49;
                          lVar42 = (long)(int)(uVar49 + 1);
                        }
                        if (0 < (int)uVar3) {
                          uVar44 = 0;
                          pfVar43 = pfVar45;
                          do {
                            fVar52 = 0.0;
                            fVar59 = 0.0;
                            if ((float)iVar1 > fVar53 &&
                                (((float)iVar2 > fVar51 && fVar51 > -1.0) && fVar53 > -1.0)) {
                              fVar52 = 0.0;
                              if (bVar46) {
                                fVar52 = *(float *)((long)pMVar14->data +
                                                   lVar39 * 4 +
                                                   pMVar14->w * lVar31 * pMVar14->elemsize +
                                                   pMVar14->cstep * uVar44 * pMVar14->elemsize);
                              }
                              if (bVar28) {
                                fVar59 = *(float *)((long)pMVar14->data +
                                                   lVar41 * 4 +
                                                   pMVar14->w * lVar31 * pMVar14->elemsize +
                                                   pMVar14->cstep * uVar44 * pMVar14->elemsize);
                              }
                              fVar55 = 0.0;
                              fVar54 = 0.0;
                              if (bVar25) {
                                fVar54 = *(float *)((long)pMVar14->data +
                                                   lVar39 * 4 +
                                                   pMVar14->w * lVar42 * pMVar14->elemsize +
                                                   pMVar14->cstep * uVar44 * pMVar14->elemsize);
                              }
                              if (bVar34) {
                                fVar55 = *(float *)((long)pMVar14->data +
                                                   lVar41 * 4 +
                                                   pMVar14->w * lVar42 * pMVar14->elemsize +
                                                   pMVar14->cstep * uVar44 * pMVar14->elemsize);
                              }
                              fVar52 = fVar52 * fVar58 + fVar55 * fVar48 +
                                       fVar59 * fVar60 + fVar54 * fVar47;
                            }
                            fVar56 = fVar56 + fVar52 * fVar57 * *pfVar43;
                            uVar44 = uVar44 + 1;
                            pfVar43 = pfVar43 + lVar30;
                          } while (uVar3 != uVar44);
                        }
                        uVar40 = uVar40 + 1;
                        pfVar45 = pfVar45 + 1;
                      } while (uVar40 != uVar10);
                    }
                    uVar32 = uVar32 + 1;
                    pfVar38 = pfVar38 + lVar35;
                  } while (uVar32 != uVar7);
                }
                fVar57 = fVar56;
                switch(iVar9) {
                case 1:
                  if (fVar56 <= 0.0) {
                    fVar57 = 0.0;
                  }
                  break;
                case 2:
                  fVar57 = (float)(~-(uint)(0.0 < fVar56) & (uint)*pfVar19 |
                                  -(uint)(0.0 < fVar56) & 0x3f800000) * fVar56;
                  break;
                case 3:
                  if (fVar56 <= *pfVar19) {
                    fVar56 = *pfVar19;
                  }
                  fVar57 = pfVar19[1];
                  if (fVar56 <= pfVar19[1]) {
                    fVar57 = fVar56;
                  }
                  break;
                case 4:
                  if (88.37626 <= fVar56) {
                    fVar56 = 88.37626;
                  }
                  fVar56 = expf((float)(-(uint)(fVar56 < -88.37626) & 0x42b0c0a5 |
                                       ~-(uint)(fVar56 < -88.37626) & (uint)-fVar56));
                  fVar57 = 1.0 / (fVar56 + 1.0);
                  break;
                case 5:
                  fVar57 = expf(fVar56);
                  fVar57 = logf(fVar57 + 1.0);
                  fVar57 = tanhf(fVar57);
                  fVar57 = fVar57 * fVar56;
                  break;
                case 6:
                  fVar51 = *pfVar19;
                  fVar53 = -pfVar19[1] / fVar51;
                  fVar57 = 0.0;
                  if ((fVar53 <= fVar56) && (fVar57 = fVar56, fVar56 <= fVar53 + 1.0 / fVar51)) {
                    fVar57 = (fVar51 * fVar56 + pfVar19[1]) * fVar56;
                  }
                }
                *(float *)((long)pvVar16 +
                          sVar17 * sVar20 * uVar37 +
                          local_1d8 * 4 + (long)iVar11 * local_1e0 * sVar20) = fVar57;
                uVar37 = uVar37 + 1;
                lVar33 = lVar33 + (long)(int)uVar3 * 4;
              } while (uVar37 != uVar4);
            }
            local_1d8 = local_1d8 + 1;
          } while (local_1d8 != _w);
        }
        local_1e0 = local_1e0 + 1;
      } while (local_1e0 != _h);
    }
    iVar29 = 0;
  }
  return iVar29;
}

Assistant:

int DeformableConv2D::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& offset = bottom_blobs[1];

    const bool has_mask = (bottom_blobs.size() == 3);

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int in_c = bottom_blob.c;
    const size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int out_w = (w + pad_left + pad_right - kernel_extent_w) / stride_w + 1;
    const int out_h = (h + pad_top + pad_bottom - kernel_extent_h) / stride_h + 1;

    // output.shape is [num_output, out_h, out_w] (in python).
    Mat& output = top_blobs[0];
    output.create(out_w, out_h, num_output, elemsize, opt.blob_allocator);
    if (output.empty())
        return -100;

    const float* weight_ptr = weight_data;
    const float* bias_ptr = weight_data;
    if (bias_term)
        bias_ptr = bias_data;

    // deformable conv
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int h_col = 0; h_col < out_h; h_col++)
    {
        for (int w_col = 0; w_col < out_w; w_col++)
        {
            int h_in = h_col * stride_h - pad_top;
            int w_in = w_col * stride_w - pad_left;
            for (int oc = 0; oc < num_output; oc++)
            {
                float sum = 0.f;
                if (bias_term)
                    sum = bias_ptr[oc];
                for (int i = 0; i < kernel_h; i++)
                {
                    for (int j = 0; j < kernel_w; j++)
                    {
                        const float offset_h = offset.channel((i * kernel_w + j) * 2).row(h_col)[w_col];
                        const float offset_w = offset.channel((i * kernel_w + j) * 2 + 1).row(h_col)[w_col];
                        const float mask_ = has_mask ? bottom_blobs[2].channel(i * kernel_w + j).row(h_col)[w_col] : 1.f;
                        const float h_im = h_in + i * dilation_h + offset_h;
                        const float w_im = w_in + j * dilation_w + offset_w;

                        // Bilinear
                        const bool cond = h_im > -1 && w_im > -1 && h_im < h && w_im < w;
                        int h_low = 0;
                        int w_low = 0;
                        int h_high = 0;
                        int w_high = 0;
                        float w1 = 0.f;
                        float w2 = 0.f;
                        float w3 = 0.f;
                        float w4 = 0.f;
                        bool v1_cond = false;
                        bool v2_cond = false;
                        bool v3_cond = false;
                        bool v4_cond = false;
                        if (cond)
                        {
                            h_low = floor(h_im);
                            w_low = floor(w_im);
                            h_high = h_low + 1;
                            w_high = w_low + 1;

                            float lh = h_im - h_low;
                            float lw = w_im - w_low;
                            float hh = 1 - lh;
                            float hw = 1 - lw;

                            v1_cond = (h_low >= 0 && w_low >= 0);
                            v2_cond = (h_low >= 0 && w_high <= w - 1);
                            v3_cond = (h_high <= h - 1 && w_low >= 0);
                            v4_cond = (h_high <= h - 1 && w_high <= w - 1);

                            w1 = hh * hw;
                            w2 = hh * lw;
                            w3 = lh * hw;
                            w4 = lh * lw;
                        }

                        for (int c_im = 0; c_im < in_c; c_im++)
                        {
                            float val = 0.f;
                            if (cond)
                            {
                                float v1 = v1_cond ? bottom_blob.channel(c_im).row(h_low)[w_low] : 0.f;
                                float v2 = v2_cond ? bottom_blob.channel(c_im).row(h_low)[w_high] : 0.f;
                                float v3 = v3_cond ? bottom_blob.channel(c_im).row(h_high)[w_low] : 0.f;
                                float v4 = v4_cond ? bottom_blob.channel(c_im).row(h_high)[w_high] : 0.f;
                                val = w1 * v1 + w2 * v2 + w3 * v3 + w4 * v4;
                            }
                            sum += val * mask_ * weight_ptr[((oc * in_c + c_im) * kernel_h + i) * kernel_w + j];
                        }
                    }
                }
                output.channel(oc).row(h_col)[w_col] = activation_ss(sum, activation_type, activation_params);
            }
        }
    }
    return 0;
}